

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O1

int qc_list_insertsort(QcList *list,QC_LIST_COMPAREFUNC CompareFunc)

{
  QcListEntry *pQVar1;
  QcListEntry *pQVar2;
  int iVar3;
  QcList *pQVar4;
  QcList *pQVar5;
  int iVar6;
  QcList *pQVar7;
  QcList *pQVar8;
  
  pQVar7 = (QcList *)list->head;
  if (pQVar7 == (QcList *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = 1;
    pQVar1 = pQVar7->head;
    while (pQVar1 != (QcListEntry *)0x0) {
      pQVar4 = list;
      pQVar5 = (QcList *)0x0;
      do {
        pQVar8 = pQVar5;
        pQVar4 = (QcList *)pQVar4->head;
        if (pQVar4 == (QcList *)pQVar7->head) goto LAB_001063c8;
        iVar3 = (*CompareFunc)(((QcList *)pQVar7->head)->cur,pQVar4->cur);
        pQVar5 = pQVar4;
      } while (-1 < iVar3);
      pQVar1 = pQVar7->head;
      pQVar2 = pQVar1->next;
      pQVar7->head = pQVar2;
      if (pQVar2 != (QcListEntry *)0x0) {
        pQVar2->prev = (QcListEntry *)pQVar7;
      }
      if (pQVar8 == (QcList *)0x0) {
        pQVar1->next = (QcListEntry *)pQVar4;
        pQVar1->prev = (QcListEntry *)0x0;
        list->head->prev = pQVar1;
        pQVar5 = list;
      }
      else {
        pQVar8->head = pQVar1;
        pQVar1->prev = (QcListEntry *)pQVar8;
        pQVar1->next = (QcListEntry *)pQVar4;
        pQVar5 = (QcList *)&pQVar4->tail;
      }
      pQVar5->head = pQVar1;
      if (pQVar1 == list->tail) {
        list->tail = (QcListEntry *)pQVar7;
      }
LAB_001063c8:
      if (pQVar4 == (QcList *)pQVar7->head) {
        pQVar7 = (QcList *)pQVar7->head;
      }
      pQVar1 = pQVar7->head;
    }
  }
  return iVar6;
}

Assistant:

int qc_list_insertsort(QcList *list, QC_LIST_COMPAREFUNC CompareFunc)
{
    QcListEntry *entry;
    QcListEntry *prev_entry;

    entry = list->head;
    prev_entry = NULL;

    if(NULL == entry)
    {
        return 0;
    }

    while(entry->next)
    {
        QcListEntry *temp_entry;

        temp_entry = list->head;
        prev_entry = NULL;
        while(temp_entry != entry->next)
        {
            if((*CompareFunc)(entry->next->data, temp_entry->data) < 0)
            {
                QcListEntry *cur_entry = entry->next;

                entry->next = entry->next->next;
                if(entry->next)
                {
                    entry->next->prev = entry;
                }

                if(prev_entry)
                {
                    prev_entry->next = cur_entry;
                    cur_entry->prev = prev_entry;

                    cur_entry->next = temp_entry;
                    temp_entry->prev = cur_entry;
                }
                else
                {
                    cur_entry->next = temp_entry;
                    cur_entry->prev = NULL;
                    list->head->prev = cur_entry;
                    list->head = cur_entry;
                }

                if(cur_entry == list->tail)
                {
                    list->tail = entry;
                }

                break;
            }

            prev_entry = temp_entry;
            temp_entry = temp_entry->next;
        } /* while ( temp_entry != entry->next ) */

        if(temp_entry == entry->next)
        {
            entry = entry->next;
        }
        else
        {
            /**/
        }
    } /* while ( entry->next != NULL ) */

    return 1;
}